

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
~HeapBucketT(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  uint uVar1;
  undefined4 *puVar2;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar6;
  ulong uVar7;
  undefined8 *in_FS_OFFSET;
  
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->heapBlockList,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             ((this->super_HeapBucket).heapInfo)->recycler);
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             ((this->super_HeapBucket).heapInfo)->recycler);
  if ((this->super_HeapBucket).heapBlockCount + (this->super_HeapBucket).newHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x69,"(this->heapBlockCount + this->newHeapBlockCount == 0)",
                       "this->heapBlockCount + this->newHeapBlockCount == 0");
    if (!bVar5) goto LAB_00220b8c;
    *puVar2 = 0;
  }
  uVar1 = (this->super_HeapBucket).emptyHeapBlockCount;
  pSVar6 = this->emptyBlockList;
  if (pSVar6 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar4 = 1;
    do {
      uVar7 = uVar4;
      this_00 = (pSVar6->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar6 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                         (&this_00->super_HeapBlock);
      uVar4 = uVar7 + 1;
    } while (pSVar6 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  if (uVar7 != uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6b,
                       "(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList))",
                       "this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)");
    if (!bVar5) goto LAB_00220b8c;
    *puVar2 = 0;
  }
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::DeleteEmptyHeapBlockList(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->emptyBlockList,0);
  if ((this->super_HeapBucket).newHeapBlockCount + (this->super_HeapBucket).heapBlockCount +
      (this->super_HeapBucket).emptyHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6e,
                       "(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0)"
                       ,
                       "this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0"
                      );
    if (!bVar5) {
LAB_00220b8c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

HeapBucketT<TBlockType>::~HeapBucketT()
{
    DeleteHeapBlockList(this->heapBlockList);
    DeleteHeapBlockList(this->fullBlockList);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (allocableHeapBlockListHead != nullptr)
    {
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
        {
            FlushInterlockedSList(this->allocableHeapBlockListHead);
        }

        _aligned_free(this->allocableHeapBlockListHead);
    }

    DeleteHeapBlockList(this->sweepableHeapBlockList);
#endif
#endif

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(this->heapBlockCount + this->newHeapBlockCount == 0);
#endif
    RECYCLER_SLOW_CHECK(Assert(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)));
    DeleteEmptyHeapBlockList(this->emptyBlockList);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    Assert(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0);
#endif
}